

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  Op *pOVar1;
  byte bVar2;
  u8 uVar3;
  int iVar4;
  Parse *pParse;
  SrcList *pSVar5;
  sqlite3 *db;
  Vdbe *v;
  WhereRightJoin *pWVar6;
  WhereLoop *pWVar7;
  Schema *pSVar8;
  Table *pTVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  Index *pIVar13;
  anon_union_16_2_b76807be_for_u *paVar14;
  Op *pOVar15;
  Schema **ppSVar16;
  IndexedExpr *pIVar17;
  int iVar18;
  WhereRightJoin *pRJ;
  uint uVar19;
  u8 *puVar20;
  int op;
  long lVar21;
  ushort uVar22;
  int iVar23;
  ulong uVar24;
  u16 *puVar25;
  Index *pIVar26;
  ulong uVar27;
  uint uVar28;
  WhereLevel *pWVar29;
  char local_7c;
  
  pParse = pWInfo->pParse;
  pSVar5 = pWInfo->pTabList;
  db = pParse->db;
  v = pParse->pVdbe;
  iVar4 = v->nOp;
  uVar24 = (ulong)pWInfo->nLevel;
  local_7c = '\0';
  cVar11 = '\0';
  if (uVar24 != 0) {
    do {
      local_7c = cVar11;
      pWVar29 = pWInfo->a + (uVar24 - 1);
      pWVar6 = pWInfo->a[uVar24 - 1].pRJ;
      if (pWVar6 != (WhereRightJoin *)0x0) {
        sqlite3VdbeResolveLabel(v,pWVar29->addrCont);
        pWVar29->addrCont = 0;
        pWVar6->endSubrtn = v->nOp;
        sqlite3VdbeAddOp3(v,0x43,pWVar6->regReturn,pWVar6->addrSubrtn,1);
        local_7c = local_7c + '\x01';
      }
      pWVar7 = pWVar29->pWLoop;
      if (pWVar29->op == 0xb8) {
        if (pWVar29->addrCont != 0) {
          sqlite3VdbeResolveLabel(v,pWVar29->addrCont);
        }
      }
      else {
        iVar18 = 0;
        iVar23 = 0;
        if ((((pWInfo->eDistinct == '\x02') && (uVar24 == pWInfo->nLevel)) &&
            ((pWVar7->wsFlags & 0x200) != 0)) &&
           (pIVar13 = (pWVar7->u).btree.pIndex, iVar18 = iVar23, (pIVar13->field_0x63 & 0x80) != 0))
        {
          uVar22 = (pWVar7->u).btree.nDistinctCol;
          if ((uVar22 != 0) && (uVar28 = (uint)uVar22, 0x23 < pIVar13->aiRowLogEst[uVar22])) {
            iVar18 = pParse->nMem + 1;
            uVar19 = 0;
            do {
              sqlite3VdbeAddOp3(v,0x5e,pWVar29->iIdxCur,uVar19,iVar18 + uVar19);
              uVar19 = uVar19 + 1;
            } while (uVar28 != uVar19);
            pParse->nMem = pParse->nMem + uVar28 + 1;
            iVar18 = sqlite3VdbeAddOp3(v,(uint)(pWVar29->op != '&') * 3 + 0x15,pWVar29->iIdxCur,0,
                                       iVar18);
            if (v->db->mallocFailed == '\0') {
              pOVar15 = v->aOp;
              pOVar15[iVar18].p4type = -3;
              pOVar15[iVar18].p4.i = uVar28;
            }
            sqlite3VdbeAddOp3(v,9,1,pWVar29->p2,0);
          }
        }
        if (pWVar29->addrCont != 0) {
          sqlite3VdbeResolveLabel(v,pWVar29->addrCont);
        }
        sqlite3VdbeAddOp3(v,(uint)pWVar29->op,pWVar29->p1,pWVar29->p2,(uint)pWVar29->p3);
        if (0 < (long)v->nOp) {
          v->aOp[(long)v->nOp + -1].p5 = (ushort)pWVar29->p5;
        }
        if (pWVar29->regBignull != 0) {
          sqlite3VdbeResolveLabel(v,pWVar29->addrBignull);
          sqlite3VdbeAddOp3(v,0x3d,pWVar29->regBignull,pWVar29->p2 + -1,0);
        }
        if (iVar18 != 0) {
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (v->db->mallocFailed == '\0') {
            pOVar15 = v->aOp + iVar18;
          }
          pOVar15->p2 = v->nOp;
        }
      }
      if (((pWVar7->wsFlags & 0x800) != 0) && (0 < (pWVar29->u).in.nIn)) {
        sqlite3VdbeResolveLabel(v,pWVar29->addrNxt);
        iVar18 = (pWVar29->u).in.nIn;
        if (0 < (long)iVar18) {
          puVar20 = &(pWVar29->u).in.aInLoop[(long)iVar18 + -1].eEndLoopOp;
          iVar18 = iVar18 + 1;
          do {
            pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (v->db->mallocFailed == '\0') {
              pOVar15 = v->aOp + (long)*(int *)(puVar20 + -0xc) + 1;
            }
            iVar23 = v->nOp;
            pOVar15->p2 = iVar23;
            if (*puVar20 != 0xb8) {
              if (*(int *)(puVar20 + -4) != 0) {
                uVar28 = pWVar7->wsFlags & 0x40400;
                if (pWVar29->iLeftJoin != 0) {
                  sqlite3VdbeAddOp3(v,0x19,((InLoop *)(puVar20 + -0x10))->iCur,
                                    (uint)(uVar28 == 0x40000) + iVar23 + 2,0);
                }
                if (uVar28 == 0x40000) {
                  iVar23 = *(int *)(puVar20 + -4);
                  iVar12 = sqlite3VdbeAddOp3(v,0x1a,pWVar29->iIdxCur,v->nOp + 2,
                                             *(int *)(puVar20 + -8));
                  if (v->db->mallocFailed == '\0') {
                    pOVar15 = v->aOp;
                    pOVar15[iVar12].p4type = -3;
                    pOVar15[iVar12].p4.i = iVar23;
                  }
                  pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (v->db->mallocFailed == '\0') {
                    pOVar15 = v->aOp + (long)*(int *)(puVar20 + -0xc) + 1;
                  }
                  pOVar15->p2 = v->nOp;
                }
              }
              sqlite3VdbeAddOp3(v,(uint)*puVar20,((InLoop *)(puVar20 + -0x10))->iCur,
                                *(int *)(puVar20 + -0xc),0);
            }
            pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (v->db->mallocFailed == '\0') {
              pOVar15 = v->aOp + (long)*(int *)(puVar20 + -0xc) + -1;
            }
            pOVar15->p2 = v->nOp;
            puVar20 = puVar20 + -0x14;
            iVar18 = iVar18 + -1;
          } while (1 < iVar18);
        }
      }
      sqlite3VdbeResolveLabel(v,pWVar29->addrBrk);
      if (pWVar29->pRJ != (WhereRightJoin *)0x0) {
        sqlite3VdbeAddOp3(v,0x43,pWVar29->pRJ->regReturn,0,1);
      }
      if (pWVar29->addrSkip != 0) {
        sqlite3VdbeAddOp3(v,9,0,pWVar29->addrSkip,0);
        iVar18 = v->nOp;
        if (v->db->mallocFailed == '\0') {
          pOVar15 = v->aOp + (long)pWVar29->addrSkip + -2;
          v->aOp[pWVar29->addrSkip].p2 = iVar18;
        }
        else {
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_0021b448 = iVar18;
        }
        pOVar15->p2 = iVar18;
      }
      if (pWVar29->addrLikeRep != 0) {
        sqlite3VdbeAddOp3(v,0x3d,pWVar29->iLikeRepCntr >> 1,pWVar29->addrLikeRep,0);
      }
      if (pWVar29->iLeftJoin != 0) {
        uVar28 = pWVar7->wsFlags;
        iVar18 = sqlite3VdbeAddOp3(v,0x3b,pWVar29->iLeftJoin,0,0);
        if ((uVar28 & 0x40) == 0) {
          sqlite3VdbeAddOp3(v,0x88,pWVar29->iTabCur,0,0);
        }
        if (((uVar28 >> 9 & 1) != 0) ||
           (((uVar28 >> 0xd & 1) != 0 && ((pWVar29->u).pCoveringIdx != (Index *)0x0)))) {
          if ((uVar28 >> 0xd & 1) != 0) {
            pIVar13 = (pWVar29->u).pCoveringIdx;
            if (pIVar13->pSchema == (Schema *)0x0) {
              iVar23 = -0x8000;
            }
            else {
              iVar23 = -1;
              ppSVar16 = &db->aDb->pSchema;
              do {
                iVar23 = iVar23 + 1;
                pSVar8 = *ppSVar16;
                ppSVar16 = ppSVar16 + 4;
              } while (pSVar8 != pIVar13->pSchema);
            }
            sqlite3VdbeAddOp3(v,0x65,pWVar29->iIdxCur,pIVar13->tnum,iVar23);
            sqlite3VdbeSetP4KeyInfo(pParse,pIVar13);
          }
          sqlite3VdbeAddOp3(v,0x88,pWVar29->iIdxCur,0,0);
        }
        if (pWVar29->op == 'C') {
          iVar23 = pWVar29->addrFirst;
          iVar12 = pWVar29->p1;
          op = 10;
        }
        else {
          iVar23 = pWVar29->addrFirst;
          op = 9;
          iVar12 = 0;
        }
        sqlite3VdbeAddOp3(v,op,iVar12,iVar23,0);
        pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (v->db->mallocFailed == '\0') {
          pOVar15 = v->aOp + iVar18;
        }
        pOVar15->p2 = v->nOp;
      }
      bVar10 = 1 < (long)uVar24;
      uVar24 = uVar24 - 1;
      cVar11 = local_7c;
    } while (bVar10);
  }
  if (pWInfo->nLevel != '\0') {
    pWVar29 = pWInfo->a;
    uVar28 = 0;
    do {
      if (pWVar29->pRJ == (WhereRightJoin *)0x0) {
        bVar2 = pWVar29->iFrom;
        if ((pSVar5->a[bVar2].fg.field_0x1 & 0x20) == 0) {
          uVar19 = pWVar29->pWLoop->wsFlags;
          if ((uVar19 & 0x240) == 0) {
            if ((uVar19 >> 0xd & 1) != 0) {
              paVar14 = &pWVar29->u;
              goto LAB_0019a376;
            }
            pIVar13 = (Index *)0x0;
          }
          else {
            paVar14 = (anon_union_16_2_b76807be_for_u *)&(pWVar29->pWLoop->u).btree.pIndex;
LAB_0019a376:
            pIVar13 = paVar14->pCoveringIdx;
          }
          if ((pIVar13 != (Index *)0x0) && (db->mallocFailed == '\0')) {
            iVar18 = iVar4;
            if ((pWInfo->eOnePass != '\0') && ((pIVar13->pTable->tabFlags & 0x80) == 0)) {
              iVar18 = pWInfo->iEndWhere;
            }
            pTVar9 = pSVar5->a[bVar2].pTab;
            if (((pIVar13->field_0x64 & 8) != 0) &&
               (pIVar17 = pParse->pIdxExpr, pIVar17 != (IndexedExpr *)0x0)) {
              iVar23 = pWVar29->iIdxCur;
              do {
                if (pIVar17->iIdxCur == iVar23) {
                  pIVar17->iDataCur = -1;
                  pIVar17->iIdxCur = -1;
                }
                pIVar17 = pIVar17->pIENext;
              } while (pIVar17 != (IndexedExpr *)0x0);
            }
            lVar21 = (long)pWVar29->addrBody + 1;
            pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (v->db->mallocFailed == '\0') {
              pOVar15 = v->aOp + lVar21;
            }
            pOVar1 = pOVar15 + (iVar18 - (int)lVar21);
            iVar18 = pWVar29->iTabCur;
            do {
              if (pOVar15->p1 == iVar18) {
                uVar3 = pOVar15->opcode;
                if (uVar3 == '\x14') {
LAB_0019a4fa:
                  pOVar15->p1 = pWVar29->iIdxCur;
                }
                else if (uVar3 == 0x87) {
                  pOVar15->p1 = pWVar29->iIdxCur;
                  pOVar15->opcode = 0x8e;
                }
                else if (uVar3 == '^') {
                  uVar24 = (ulong)pOVar15->p2;
                  if ((char)pTVar9->tabFlags < '\0') {
                    for (pIVar26 = pTVar9->pIndex;
                        (pIVar26 != (Index *)0x0 && ((*(ushort *)&pIVar26->field_0x63 & 3) != 2));
                        pIVar26 = pIVar26->pNext) {
                    }
                    uVar24 = (ulong)(ushort)pIVar26->aiColumn[uVar24];
                  }
                  else if ((-1 < (short)pOVar15->p2) && ((pTVar9->tabFlags & 0x20) != 0)) {
                    puVar25 = &pTVar9->aCol->colFlags;
                    lVar21 = -1;
                    do {
                      uVar22 = (short)uVar24 + (ushort)((*puVar25 >> 5 & 1) != 0);
                      uVar24 = (ulong)uVar22;
                      lVar21 = lVar21 + 1;
                      puVar25 = puVar25 + 8;
                    } while (lVar21 < (short)uVar22);
                  }
                  uVar22 = 0xffff;
                  if ((ulong)pIVar13->nColumn != 0) {
                    uVar27 = 0;
                    do {
                      if (pIVar13->aiColumn[uVar27] == (short)uVar24) {
                        uVar22 = (ushort)uVar27;
                        break;
                      }
                      uVar27 = uVar27 + 1;
                      uVar22 = 0xffff;
                    } while (pIVar13->nColumn != uVar27);
                  }
                  if (-1 < (short)uVar22) {
                    pOVar15->p2 = (uint)uVar22;
                    goto LAB_0019a4fa;
                  }
                }
              }
              pOVar15 = pOVar15 + 1;
            } while (pOVar15 < pOVar1);
          }
        }
        else {
          translateColumnToCopy
                    (pParse,pWVar29->addrBody,pWVar29->iTabCur,pSVar5->a[bVar2].regResult,0);
        }
      }
      else {
        sqlite3WhereRightJoinLoop(pWInfo,uVar28,pWVar29);
      }
      uVar28 = uVar28 + 1;
      pWVar29 = pWVar29 + 1;
    } while (uVar28 < pWInfo->nLevel);
  }
  sqlite3VdbeResolveLabel(v,pWInfo->iBreak);
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn - local_7c;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;
  int iEnd = sqlite3VdbeCurrentAddr(v);
  int nRJ = 0;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    if( pLevel->pRJ ){
      /* Terminate the subroutine that forms the interior of the loop of
      ** the RIGHT JOIN table */
      WhereRightJoin *pRJ = pLevel->pRJ;
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      pLevel->addrCont = 0;
      pRJ->endSubrtn = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_Return, pRJ->regReturn, pRJ->addrSubrtn, 1);
      VdbeCoverage(v);
      nRJ++;
    }
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nDistinctCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      if( pLevel->addrCont ) sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
      if( pLevel->regBignull ){
        sqlite3VdbeResolveLabel(v, pLevel->addrBignull);
        sqlite3VdbeAddOp2(v, OP_DecrJumpZero, pLevel->regBignull, pLevel->p2-1);
        VdbeCoverage(v);
      }
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else if( pLevel->addrCont ){
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( (pLoop->wsFlags & WHERE_IN_ABLE)!=0 && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        assert( sqlite3VdbeGetOp(v, pIn->addrInTop+1)->opcode==OP_IsNull
                 || pParse->db->mallocFailed );
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            int bEarlyOut =
                (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
                 && (pLoop->wsFlags & WHERE_IN_EARLYOUT)!=0;
            if( pLevel->iLeftJoin ){
              /* For LEFT JOIN queries, cursor pIn->iCur may not have been
              ** opened yet. This occurs for WHERE clauses such as
              ** "a = ? AND b IN (...)", where the index is on (a, b). If
              ** the RHS of the (a=?) is NULL, then the "b IN (...)" may
              ** never have been coded, but the body of the loop run to
              ** return the null-row. So, if the cursor is not open yet,
              ** jump over the OP_Next or OP_Prev instruction about to
              ** be coded.  */
              sqlite3VdbeAddOp2(v, OP_IfNotOpen, pIn->iCur,
                  sqlite3VdbeCurrentAddr(v) + 2 + bEarlyOut);
              VdbeCoverage(v);
            }
            if( bEarlyOut ){
              sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                  sqlite3VdbeCurrentAddr(v)+2,
                  pIn->iBase, pIn->nPrefix);
              VdbeCoverage(v);
              /* Retarget the OP_IsNull against the left operand of IN so
              ** it jumps past the OP_IfNoHope.  This is because the
              ** OP_IsNull also bypasses the OP_Affinity opcode that is
              ** required by OP_IfNoHope. */
              sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
            }
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->pRJ ){
      sqlite3VdbeAddOp3(v, OP_Return, pLevel->pRJ->regReturn, 0, 1);
      VdbeCoverage(v);
    }
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        assert( pLevel->iTabCur==pTabList->a[pLevel->iFrom].iCursor );
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED)
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCoveringIdx)
      ){
        if( ws & WHERE_MULTI_OR ){
          Index *pIx = pLevel->u.pCoveringIdx;
          int iDb = sqlite3SchemaToIndex(db, pIx->pSchema);
          sqlite3VdbeAddOp3(v, OP_ReopenIdx, pLevel->iIdxCur, pIx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp, *pLastOp;
    Index *pIdx = 0;
    SrcItem *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* Do RIGHT JOIN processing.  Generate code that will output the
    ** unmatched rows of the right operand of the RIGHT JOIN with
    ** all of the columns of the left operand set to NULL.
    */
    if( pLevel->pRJ ){
      sqlite3WhereRightJoinLoop(pWInfo, i, pLevel);
      continue;
    }

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    **
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCoveringIdx;
    }
    if( pIdx
     && !db->mallocFailed
    ){
      if( pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable) ){
        last = iEnd;
      }else{
        last = pWInfo->iEndWhere;
      }
      if( pIdx->bHasExpr ){
        IndexedExpr *p = pParse->pIdxExpr;
        while( p ){
          if( p->iIdxCur==pLevel->iIdxCur ){
            p->iDataCur = -1;
            p->iIdxCur = -1;
          }
          p = p->pIENext;
        }
      }
      k = pLevel->addrBody + 1;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE opcodes in range %d..%d\n", k, last-1);
      }
      /* Proof that the "+1" on the k value above is safe */
      pOp = sqlite3VdbeGetOp(v, k - 1);
      assert( pOp->opcode!=OP_Column || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_Rowid  || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_IfNullRow || pOp->p1!=pLevel->iTabCur );
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      pLastOp = pOp + (last - k);
      assert( pOp<=pLastOp );
      do{
        if( pOp->p1!=pLevel->iTabCur ){
          /* no-op */
        }else if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
          if( pOp->opcode==OP_Offset ){
            /* Do not need to translate the column number */
          }else
#endif
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }else{
            testcase( x!=sqlite3StorageColumnToTable(pTab,x) );
            x = sqlite3StorageColumnToTable(pTab,x);
          }
          x = sqlite3TableColumnToIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }else{
            /* Unable to translate the table reference into an index
            ** reference.  Verify that this is harmless - that the
            ** table being referenced really is open.
            */
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
            assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0
                 || cursorIsOpen(v,pOp->p1,k)
                 || pOp->opcode==OP_Offset
            );
#else
            assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0
                 || cursorIsOpen(v,pOp->p1,k)
            );
#endif
          }
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
#ifdef SQLITE_DEBUG
        k++;
#endif
      }while( (++pOp)<pLastOp );
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  pParse->withinRJSubrtn -= nRJ;
  return;
}